

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O0

void duckdb::WriteCSVFlushBatch
               (ClientContext *context,FunctionData *bind_data,GlobalFunctionData *gstate,
               PreparedBatchData *batch)

{
  WriteCSVBatchData *newline;
  MemoryStream *this;
  idx_t in_RCX;
  const_data_ptr_t in_RDX;
  GlobalWriteCSVData *in_RSI;
  MemoryStream *writer;
  WriteCSVData *csv_data;
  GlobalWriteCSVData *global_state;
  WriteCSVBatchData *csv_batch;
  FunctionData *in_stack_ffffffffffffffb0;
  
  newline = PreparedBatchData::Cast<duckdb::WriteCSVBatchData>
                      ((PreparedBatchData *)in_stack_ffffffffffffffb0);
  GlobalFunctionData::Cast<duckdb::GlobalWriteCSVData>
            ((GlobalFunctionData *)in_stack_ffffffffffffffb0);
  FunctionData::Cast<duckdb::WriteCSVData>(in_stack_ffffffffffffffb0);
  this = &newline->stream;
  MemoryStream::GetData(this);
  MemoryStream::GetPosition(this);
  GlobalWriteCSVData::WriteRows(in_RSI,in_RDX,in_RCX,(string *)newline);
  MemoryStream::Rewind(this);
  return;
}

Assistant:

void WriteCSVFlushBatch(ClientContext &context, FunctionData &bind_data, GlobalFunctionData &gstate,
                        PreparedBatchData &batch) {
	auto &csv_batch = batch.Cast<WriteCSVBatchData>();
	auto &global_state = gstate.Cast<GlobalWriteCSVData>();
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &writer = csv_batch.stream;
	global_state.WriteRows(writer.GetData(), writer.GetPosition(), csv_data.newline);
	writer.Rewind();
}